

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  bool bVar1;
  int iVar2;
  long in_RDX;
  long in_RDI;
  Node *next;
  int level;
  Node *x;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *pSVar3;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_00;
  
  pSVar3 = *(SkipList<const_char_*,_leveldb::MemTable::KeyComparator> **)(in_RDI + 0x18);
  iVar2 = GetMaxHeight((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar2 = iVar2 + -1;
  while( true ) {
    do {
      this_00 = pSVar3;
      in_stack_ffffffffffffffd0 =
           (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)
           Node::Next((Node *)in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
      bVar1 = KeyIsAfterNode(this_00,(char **)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                             (Node *)in_stack_ffffffffffffffd0);
      pSVar3 = in_stack_ffffffffffffffd0;
    } while (bVar1);
    if (in_RDX != 0) {
      *(SkipList<const_char_*,_leveldb::MemTable::KeyComparator> **)(in_RDX + (long)iVar2 * 8) =
           this_00;
    }
    if (iVar2 == 0) break;
    iVar2 = iVar2 + -1;
    pSVar3 = this_00;
  }
  return (Node *)in_stack_ffffffffffffffd0;
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}